

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepScanLineInputFile::Data::LineBufferTask::execute(LineBufferTask *this)

{
  DeepFrameBuffer *in_RDI;
  int unaff_retaddr;
  exr_const_context_t in_stack_00000008;
  ScanLineProcess *in_stack_00000010;
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *in_stack_00000020;
  exception *e;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1a7828);
  anon_unknown_12::ScanLineProcess::run_decode
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,
             in_stack_fffffffffffffff0,in_stack_00000020);
  return;
}

Assistant:

void DeepScanLineInputFile::Data::LineBufferTask::execute ()
{
    try
    {
        _line->run_decode (
            *(_ifd->_ctxt),
            _ifd->partNumber,
            _outfb,
            _fby,
            _last_fby,
            _ifd->fill_list);
    }
    catch (std::exception &e)
    {
        _line_group->record_failure (e.what ());
    }
    catch (...)
    {
        _line_group->record_failure ("Unknown exception");
    }
}